

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbinode.cpp
# Opt level: O0

RBBINode * __thiscall icu_63::RBBINode::cloneTree(RBBINode *this)

{
  RBBINode *pRVar1;
  size_t in_RSI;
  RBBINode *local_48;
  RBBINode *local_18;
  RBBINode *n;
  RBBINode *this_local;
  
  if (this->fType == varRef) {
    local_18 = cloneTree(this->fLeftChild);
  }
  else {
    local_18 = this;
    if (this->fType != uset) {
      pRVar1 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,in_RSI);
      local_48 = (RBBINode *)0x0;
      if (pRVar1 != (RBBINode *)0x0) {
        RBBINode(pRVar1,this);
        local_48 = pRVar1;
      }
      local_18 = local_48;
      if (local_48 != (RBBINode *)0x0) {
        if (this->fLeftChild != (RBBINode *)0x0) {
          pRVar1 = cloneTree(this->fLeftChild);
          local_48->fLeftChild = pRVar1;
          local_48->fLeftChild->fParent = local_48;
        }
        if (this->fRightChild != (RBBINode *)0x0) {
          pRVar1 = cloneTree(this->fRightChild);
          local_48->fRightChild = pRVar1;
          local_48->fRightChild->fParent = local_48;
        }
      }
    }
  }
  return local_18;
}

Assistant:

RBBINode *RBBINode::cloneTree() {
    RBBINode    *n;

    if (fType == RBBINode::varRef) {
        // If the current node is a variable reference, skip over it
        //   and clone the definition of the variable instead.
        n = fLeftChild->cloneTree();
    } else if (fType == RBBINode::uset) {
        n = this;
    } else {
        n = new RBBINode(*this);
        // Check for null pointer.
        if (n != NULL) {
            if (fLeftChild != NULL) {
                n->fLeftChild          = fLeftChild->cloneTree();
                n->fLeftChild->fParent = n;
            }
            if (fRightChild != NULL) {
                n->fRightChild          = fRightChild->cloneTree();
                n->fRightChild->fParent = n;
            }
        }
    }
    return n;
}